

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

void __thiscall
perfetto::protos::gen::HeapprofdConfig::Serialize(HeapprofdConfig *this,Message *msg)

{
  pointer pbVar1;
  unsigned_long *puVar2;
  _Head_base<0UL,_perfetto::protos::gen::HeapprofdConfig_ContinuousDumpConfig_*,_false> this_00;
  uint8_t *src_begin;
  uint uVar3;
  ulong uVar4;
  Message *msg_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *it;
  unsigned_long *puVar5;
  pointer pbVar6;
  
  uVar4 = (this->_has_field_).super__Base_bitset<1UL>._M_w;
  uVar3 = (uint)uVar4;
  if ((uVar4 & 2) != 0) {
    protozero::Message::AppendVarInt<unsigned_long>(msg,1,this->sampling_interval_bytes_);
    uVar3 = (uint)(this->_has_field_).super__Base_bitset<1UL>._M_w;
  }
  if ((uVar3 >> 0x18 & 1) != 0) {
    protozero::Message::AppendVarInt<unsigned_long>
              (msg,0x18,this->adaptive_sampling_shmem_threshold_);
    uVar3 = (uint)(this->_has_field_).super__Base_bitset<1UL>._M_w;
  }
  if ((uVar3 >> 0x19 & 1) != 0) {
    protozero::Message::AppendVarInt<unsigned_long>
              (msg,0x19,this->adaptive_sampling_max_sampling_interval_bytes_);
  }
  pbVar1 = (this->process_cmdline_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar6 = (this->process_cmdline_).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar6 != pbVar1; pbVar6 = pbVar6 + 1) {
    protozero::Message::AppendBytes(msg,2,(pbVar6->_M_dataplus)._M_p,pbVar6->_M_string_length);
  }
  puVar2 = (this->pid_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (puVar5 = (this->pid_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start; puVar5 != puVar2; puVar5 = puVar5 + 1) {
    protozero::Message::AppendVarInt<unsigned_long>(msg,4,*puVar5);
  }
  pbVar1 = (this->target_installed_by_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar6 = (this->target_installed_by_).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar6 != pbVar1; pbVar6 = pbVar6 + 1) {
    protozero::Message::AppendBytes(msg,0x1a,(pbVar6->_M_dataplus)._M_p,pbVar6->_M_string_length);
  }
  pbVar1 = (this->heaps_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar6 = (this->heaps_).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar6 != pbVar1; pbVar6 = pbVar6 + 1) {
    protozero::Message::AppendBytes(msg,0x14,(pbVar6->_M_dataplus)._M_p,pbVar6->_M_string_length);
  }
  pbVar1 = (this->exclude_heaps_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar6 = (this->exclude_heaps_).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar6 != pbVar1; pbVar6 = pbVar6 + 1) {
    protozero::Message::AppendBytes(msg,0x1b,(pbVar6->_M_dataplus)._M_p,pbVar6->_M_string_length);
  }
  if (((this->_has_field_).super__Base_bitset<1UL>._M_w & 0x800000) != 0) {
    protozero::Message::AppendTinyVarInt(msg,0x17,(uint)this->stream_allocations_);
  }
  puVar2 = (this->heap_sampling_intervals_).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (puVar5 = (this->heap_sampling_intervals_).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start; puVar5 != puVar2; puVar5 = puVar5 + 1) {
    protozero::Message::AppendVarInt<unsigned_long>(msg,0x16,*puVar5);
  }
  uVar4 = (this->_has_field_).super__Base_bitset<1UL>._M_w;
  if (((uint)uVar4 >> 0x15 & 1) != 0) {
    protozero::Message::AppendTinyVarInt(msg,0x15,(uint)this->all_heaps_);
    uVar4 = (this->_has_field_).super__Base_bitset<1UL>._M_w;
  }
  uVar3 = (uint)uVar4;
  if ((uVar4 & 0x20) != 0) {
    protozero::Message::AppendTinyVarInt(msg,5,(uint)this->all_);
    uVar3 = (uint)(this->_has_field_).super__Base_bitset<1UL>._M_w;
  }
  if ((short)uVar3 < 0) {
    protozero::Message::AppendVarInt<unsigned_int>(msg,0xf,this->min_anonymous_memory_kb_);
    uVar3 = (uint)(this->_has_field_).super__Base_bitset<1UL>._M_w;
  }
  if ((uVar3 >> 0x10 & 1) != 0) {
    protozero::Message::AppendVarInt<unsigned_int>(msg,0x10,this->max_heapprofd_memory_kb_);
    uVar3 = (uint)(this->_has_field_).super__Base_bitset<1UL>._M_w;
  }
  if ((uVar3 >> 0x11 & 1) != 0) {
    protozero::Message::AppendVarInt<unsigned_long>(msg,0x11,this->max_heapprofd_cpu_secs_);
  }
  pbVar1 = (this->skip_symbol_prefix_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar6 = (this->skip_symbol_prefix_).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar6 != pbVar1; pbVar6 = pbVar6 + 1) {
    protozero::Message::AppendBytes(msg,7,(pbVar6->_M_dataplus)._M_p,pbVar6->_M_string_length);
  }
  uVar4 = (this->_has_field_).super__Base_bitset<1UL>._M_w;
  uVar3 = (uint)uVar4;
  if ((uVar4 & 0x40) != 0) {
    this_00._M_head_impl =
         (this->continuous_dump_config_).ptr_._M_t.
         super___uniq_ptr_impl<perfetto::protos::gen::HeapprofdConfig_ContinuousDumpConfig,_std::default_delete<perfetto::protos::gen::HeapprofdConfig_ContinuousDumpConfig>_>
         ._M_t.
         super__Tuple_impl<0UL,_perfetto::protos::gen::HeapprofdConfig_ContinuousDumpConfig_*,_std::default_delete<perfetto::protos::gen::HeapprofdConfig_ContinuousDumpConfig>_>
         .
         super__Head_base<0UL,_perfetto::protos::gen::HeapprofdConfig_ContinuousDumpConfig_*,_false>
         ._M_head_impl;
    msg_00 = protozero::Message::BeginNestedMessageInternal(msg,6);
    HeapprofdConfig_ContinuousDumpConfig::Serialize(this_00._M_head_impl,msg_00);
    uVar3 = (uint)(this->_has_field_).super__Base_bitset<1UL>._M_w;
  }
  if ((uVar3 >> 8 & 1) != 0) {
    protozero::Message::AppendVarInt<unsigned_long>(msg,8,this->shmem_size_bytes_);
    uVar3 = (uint)(this->_has_field_).super__Base_bitset<1UL>._M_w;
  }
  if ((uVar3 >> 9 & 1) != 0) {
    protozero::Message::AppendTinyVarInt(msg,9,(uint)this->block_client_);
    uVar3 = (uint)(this->_has_field_).super__Base_bitset<1UL>._M_w;
  }
  if ((uVar3 >> 0xe & 1) != 0) {
    protozero::Message::AppendVarInt<unsigned_int>(msg,0xe,this->block_client_timeout_us_);
    uVar3 = (uint)(this->_has_field_).super__Base_bitset<1UL>._M_w;
  }
  if ((uVar3 >> 10 & 1) != 0) {
    protozero::Message::AppendTinyVarInt(msg,10,(uint)this->no_startup_);
    uVar3 = (uint)(this->_has_field_).super__Base_bitset<1UL>._M_w;
  }
  if ((uVar3 >> 0xb & 1) != 0) {
    protozero::Message::AppendTinyVarInt(msg,0xb,(uint)this->no_running_);
    uVar3 = (uint)(this->_has_field_).super__Base_bitset<1UL>._M_w;
  }
  if ((uVar3 >> 0xd & 1) != 0) {
    protozero::Message::AppendTinyVarInt(msg,0xd,(uint)this->dump_at_max_);
    uVar3 = (uint)(this->_has_field_).super__Base_bitset<1UL>._M_w;
  }
  if ((uVar3 >> 0x12 & 1) != 0) {
    protozero::Message::AppendTinyVarInt(msg,0x12,(uint)this->disable_fork_teardown_);
    uVar3 = (uint)(this->_has_field_).super__Base_bitset<1UL>._M_w;
  }
  if ((uVar3 >> 0x13 & 1) != 0) {
    protozero::Message::AppendTinyVarInt(msg,0x13,(uint)this->disable_vfork_detection_);
  }
  src_begin = (uint8_t *)(this->unknown_fields_)._M_dataplus._M_p;
  protozero::Message::WriteToStream
            (msg,src_begin,src_begin + (this->unknown_fields_)._M_string_length);
  return;
}

Assistant:

void HeapprofdConfig::Serialize(::protozero::Message* msg) const {
  // Field 1: sampling_interval_bytes
  if (_has_field_[1]) {
    msg->AppendVarInt(1, sampling_interval_bytes_);
  }

  // Field 24: adaptive_sampling_shmem_threshold
  if (_has_field_[24]) {
    msg->AppendVarInt(24, adaptive_sampling_shmem_threshold_);
  }

  // Field 25: adaptive_sampling_max_sampling_interval_bytes
  if (_has_field_[25]) {
    msg->AppendVarInt(25, adaptive_sampling_max_sampling_interval_bytes_);
  }

  // Field 2: process_cmdline
  for (auto& it : process_cmdline_) {
    msg->AppendString(2, it);
  }

  // Field 4: pid
  for (auto& it : pid_) {
    msg->AppendVarInt(4, it);
  }

  // Field 26: target_installed_by
  for (auto& it : target_installed_by_) {
    msg->AppendString(26, it);
  }

  // Field 20: heaps
  for (auto& it : heaps_) {
    msg->AppendString(20, it);
  }

  // Field 27: exclude_heaps
  for (auto& it : exclude_heaps_) {
    msg->AppendString(27, it);
  }

  // Field 23: stream_allocations
  if (_has_field_[23]) {
    msg->AppendTinyVarInt(23, stream_allocations_);
  }

  // Field 22: heap_sampling_intervals
  for (auto& it : heap_sampling_intervals_) {
    msg->AppendVarInt(22, it);
  }

  // Field 21: all_heaps
  if (_has_field_[21]) {
    msg->AppendTinyVarInt(21, all_heaps_);
  }

  // Field 5: all
  if (_has_field_[5]) {
    msg->AppendTinyVarInt(5, all_);
  }

  // Field 15: min_anonymous_memory_kb
  if (_has_field_[15]) {
    msg->AppendVarInt(15, min_anonymous_memory_kb_);
  }

  // Field 16: max_heapprofd_memory_kb
  if (_has_field_[16]) {
    msg->AppendVarInt(16, max_heapprofd_memory_kb_);
  }

  // Field 17: max_heapprofd_cpu_secs
  if (_has_field_[17]) {
    msg->AppendVarInt(17, max_heapprofd_cpu_secs_);
  }

  // Field 7: skip_symbol_prefix
  for (auto& it : skip_symbol_prefix_) {
    msg->AppendString(7, it);
  }

  // Field 6: continuous_dump_config
  if (_has_field_[6]) {
    (*continuous_dump_config_).Serialize(msg->BeginNestedMessage<::protozero::Message>(6));
  }

  // Field 8: shmem_size_bytes
  if (_has_field_[8]) {
    msg->AppendVarInt(8, shmem_size_bytes_);
  }

  // Field 9: block_client
  if (_has_field_[9]) {
    msg->AppendTinyVarInt(9, block_client_);
  }

  // Field 14: block_client_timeout_us
  if (_has_field_[14]) {
    msg->AppendVarInt(14, block_client_timeout_us_);
  }

  // Field 10: no_startup
  if (_has_field_[10]) {
    msg->AppendTinyVarInt(10, no_startup_);
  }

  // Field 11: no_running
  if (_has_field_[11]) {
    msg->AppendTinyVarInt(11, no_running_);
  }

  // Field 13: dump_at_max
  if (_has_field_[13]) {
    msg->AppendTinyVarInt(13, dump_at_max_);
  }

  // Field 18: disable_fork_teardown
  if (_has_field_[18]) {
    msg->AppendTinyVarInt(18, disable_fork_teardown_);
  }

  // Field 19: disable_vfork_detection
  if (_has_field_[19]) {
    msg->AppendTinyVarInt(19, disable_vfork_detection_);
  }

  msg->AppendRawProtoBytes(unknown_fields_.data(), unknown_fields_.size());
}